

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldCex.c
# Opt level: O3

void Saig_ManCbaStop(Saig_ManCba_t *p)

{
  Vec_Vec_t *pVVar1;
  void *pvVar2;
  int iVar3;
  Vec_Int_t *__ptr;
  long lVar4;
  
  pVVar1 = p->vReg2Frame;
  if (pVVar1 != (Vec_Vec_t *)0x0) {
    iVar3 = pVVar1->nSize;
    if (0 < iVar3) {
      lVar4 = 0;
      do {
        pvVar2 = pVVar1->pArray[lVar4];
        if (pvVar2 != (void *)0x0) {
          if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar2 + 8));
          }
          free(pvVar2);
          iVar3 = pVVar1->nSize;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < iVar3);
    }
    if (pVVar1->pArray != (void **)0x0) {
      free(pVVar1->pArray);
    }
    free(pVVar1);
    p->vReg2Frame = (Vec_Vec_t *)0x0;
  }
  pVVar1 = p->vReg2Value;
  if (pVVar1 != (Vec_Vec_t *)0x0) {
    iVar3 = pVVar1->nSize;
    if (0 < iVar3) {
      lVar4 = 0;
      do {
        pvVar2 = pVVar1->pArray[lVar4];
        if (pvVar2 != (void *)0x0) {
          if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar2 + 8));
          }
          free(pvVar2);
          iVar3 = pVVar1->nSize;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < iVar3);
    }
    if (pVVar1->pArray != (void **)0x0) {
      free(pVVar1->pArray);
    }
    free(pVVar1);
    p->vReg2Value = (Vec_Vec_t *)0x0;
  }
  Aig_ManStopP(&p->pFrames);
  __ptr = p->vMapPiF2A;
  if (__ptr != (Vec_Int_t *)0x0) {
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
      p->vMapPiF2A->pArray = (int *)0x0;
      __ptr = p->vMapPiF2A;
      if (__ptr == (Vec_Int_t *)0x0) goto LAB_006180e7;
    }
    free(__ptr);
  }
LAB_006180e7:
  free(p);
  return;
}

Assistant:

void Saig_ManCbaStop( Saig_ManCba_t * p )
{
    Vec_VecFreeP( &p->vReg2Frame );
    Vec_VecFreeP( &p->vReg2Value );
    Aig_ManStopP( &p->pFrames );
    Vec_IntFreeP( &p->vMapPiF2A );
    ABC_FREE( p );
}